

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DistanceGraph.cc
# Opt level: O0

vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> * __thiscall
DistanceGraph::find_bubbles(DistanceGraph *this,uint32_t min_size,uint32_t max_size)

{
  ulong uVar1;
  bool bVar2;
  DistanceGraph *this_00;
  size_type sVar3;
  reference pvVar4;
  uint in_ECX;
  uint in_EDX;
  long *in_RSI;
  vector<bool,_std::allocator<bool>_> *pvVar5;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *in_RDI;
  reference rVar6;
  reference rVar7;
  reference rVar8;
  vector<Link,_std::allocator<Link>_> parlp;
  vector<Link,_std::allocator<Link>_> parln;
  sgNodeID_t prev;
  sgNodeID_t next;
  vector<Link,_std::allocator<Link>_> bwl;
  vector<Link,_std::allocator<Link>_> fwl;
  size_t s2;
  size_t s1;
  sgNodeID_t n2;
  sgNodeID_t n1;
  vector<bool,_std::allocator<bool>_> used;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *r;
  _Bit_type in_stack_fffffffffffffe60;
  allocator_type *in_stack_fffffffffffffe68;
  bool *in_stack_fffffffffffffe70;
  vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *this_01;
  _Bit_type *in_stack_fffffffffffffe78;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffe80;
  reference local_128;
  reference local_118;
  vector<Link,_std::allocator<Link>_> local_108;
  vector<Link,_std::allocator<Link>_> local_f0;
  sgNodeID_t local_d8;
  sgNodeID_t local_d0;
  vector<Link,_std::allocator<Link>_> local_c8;
  undefined4 local_ac;
  vector<Link,_std::allocator<Link>_> local_a8;
  reference local_90;
  ulong local_80;
  ulong local_78;
  vector<bool,_std::allocator<bool>_> *local_70;
  ulong local_68;
  undefined1 local_49;
  byte local_19;
  uint local_18;
  uint local_14;
  
  local_19 = 0;
  local_18 = in_ECX;
  local_14 = in_EDX;
  std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::vector
            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)0x39135c);
  this_00 = (DistanceGraph *)
            std::vector<Node,_std::allocator<Node>_>::size
                      ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40));
  local_49 = 0;
  std::allocator<bool>::allocator((allocator<bool> *)0x39138c);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_fffffffffffffe80,(size_type)in_stack_fffffffffffffe78,
             in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<bool>::~allocator((allocator<bool> *)0x3913ba);
  rVar7._M_mask = (_Bit_type)in_stack_fffffffffffffe70;
  rVar7._M_p = in_stack_fffffffffffffe78;
  rVar8._M_mask = in_stack_fffffffffffffe60;
  rVar8._M_p = (_Bit_type *)in_stack_fffffffffffffe68;
  local_68 = 1;
  do {
    uVar1 = local_68;
    sVar3 = std::vector<Node,_std::allocator<Node>_>::size
                      ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40));
    this_01 = (vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_> *)
              rVar7._M_mask;
    if (sVar3 <= uVar1) {
      local_19 = 1;
      local_ac = 1;
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)0x391934);
      if ((local_19 & 1) == 0) {
        std::vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>::~vector
                  (this_01);
      }
      return in_RDI;
    }
    rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (in_stack_fffffffffffffe80,(size_type)rVar7._M_p);
    local_90 = rVar6;
    bVar2 = std::_Bit_reference::operator_cast_to_bool(&local_90);
    if (!bVar2) {
      std::vector<Node,_std::allocator<Node>_>::operator[]
                ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40),local_68);
      local_78 = std::__cxx11::string::size();
      if ((local_14 <= local_78) && (local_78 <= local_18)) {
        get_fw_links(this_00,(sgNodeID_t)in_RSI);
        sVar3 = std::vector<Link,_std::allocator<Link>_>::size(&local_a8);
        if (sVar3 == 1) {
          get_bw_links((DistanceGraph *)rVar8._M_p,rVar8._M_mask);
          sVar3 = std::vector<Link,_std::allocator<Link>_>::size(&local_c8);
          if (sVar3 == 1) {
            pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_a8,0);
            local_d0 = pvVar4->dest;
            pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_c8,0);
            local_d8 = pvVar4->dest;
            get_bw_links((DistanceGraph *)rVar8._M_p,rVar8._M_mask);
            sVar3 = std::vector<Link,_std::allocator<Link>_>::size(&local_f0);
            if (sVar3 == 2) {
              get_fw_links(this_00,(sgNodeID_t)in_RSI);
              sVar3 = std::vector<Link,_std::allocator<Link>_>::size(&local_108);
              if (sVar3 == 2) {
                pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_108,0);
                if (pvVar4->dest == local_68) {
                  pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_108,1);
                  local_70 = (vector<bool,_std::allocator<bool>_> *)pvVar4->dest;
                }
                else {
                  pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_108,0);
                  local_70 = (vector<bool,_std::allocator<bool>_> *)pvVar4->dest;
                }
                pvVar5 = local_70;
                pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_f0,0);
                if (pvVar5 != (vector<bool,_std::allocator<bool>_> *)-pvVar4->dest) {
                  in_stack_fffffffffffffe80 = local_70;
                  pvVar4 = std::vector<Link,_std::allocator<Link>_>::operator[](&local_f0,1);
                  if (in_stack_fffffffffffffe80 !=
                      (vector<bool,_std::allocator<bool>_> *)-pvVar4->dest) {
                    local_ac = 4;
                    goto LAB_0039186c;
                  }
                }
                pvVar5 = local_70;
                if ((long)local_70 < 1) {
                  pvVar5 = (vector<bool,_std::allocator<bool>_> *)-(long)local_70;
                }
                std::vector<Node,_std::allocator<Node>_>::operator[]
                          ((vector<Node,_std::allocator<Node>_> *)(*in_RSI + 0x40),(size_type)pvVar5
                          );
                local_80 = std::__cxx11::string::size();
                if ((local_80 < local_14) || (local_18 < local_80)) {
                  local_ac = 4;
                }
                else {
                  rVar7 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    (in_stack_fffffffffffffe80,(size_type)rVar7._M_p);
                  local_118 = rVar7;
                  std::_Bit_reference::operator=(&local_118,true);
                  rVar8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                    (in_stack_fffffffffffffe80,(size_type)rVar7._M_p);
                  local_128 = rVar8;
                  std::_Bit_reference::operator=(&local_128,true);
                  std::vector<std::pair<long,long>,std::allocator<std::pair<long,long>>>::
                  emplace_back<long&,long&>
                            ((vector<std::pair<long,_long>,_std::allocator<std::pair<long,_long>_>_>
                              *)rVar7._M_mask,(long *)rVar8._M_p,(long *)rVar8._M_mask);
                  local_ac = 0;
                }
              }
              else {
                local_ac = 4;
              }
LAB_0039186c:
              std::vector<Link,_std::allocator<Link>_>::~vector
                        ((vector<Link,_std::allocator<Link>_> *)rVar7._M_mask);
            }
            else {
              local_ac = 4;
            }
            std::vector<Link,_std::allocator<Link>_>::~vector
                      ((vector<Link,_std::allocator<Link>_> *)rVar7._M_mask);
          }
          else {
            local_ac = 4;
          }
          std::vector<Link,_std::allocator<Link>_>::~vector
                    ((vector<Link,_std::allocator<Link>_> *)rVar7._M_mask);
        }
        else {
          local_ac = 4;
        }
        std::vector<Link,_std::allocator<Link>_>::~vector
                  ((vector<Link,_std::allocator<Link>_> *)rVar7._M_mask);
      }
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

std::vector<std::pair<sgNodeID_t,sgNodeID_t>> DistanceGraph::find_bubbles(uint32_t min_size,uint32_t max_size) const {
    std::vector<std::pair<sgNodeID_t,sgNodeID_t>> r;
    std::vector<bool> used(sdg.nodes.size(),false);
    sgNodeID_t n1,n2;
    size_t s1,s2;
    for (n1=1;n1<sdg.nodes.size();++n1){
        if (used[n1]) continue;
        //get "topologically correct" bubble: prev -> [n1 | n2] -> next
        s1=sdg.nodes[n1].sequence.size();
        if (s1<min_size or s1>max_size) continue;

        auto fwl=get_fw_links(n1);
        if (fwl.size()!=1) continue;
        auto bwl=get_bw_links(n1);
        if (bwl.size()!=1) continue;
        auto next=fwl[0].dest;
        auto prev=bwl[0].dest;
        auto parln=get_bw_links(next);
        if (parln.size()!=2) continue;
        auto parlp=get_fw_links(-prev);
        if (parlp.size()!=2) continue;

        if (parlp[0].dest!=n1) n2=parlp[0].dest;
        else n2=parlp[1].dest;

        if (n2!=-parln[0].dest and n2!=-parln[1].dest) continue;
        s2=sdg.nodes[llabs(n2)].sequence.size();
        if (s2<min_size or s2>max_size) continue;

        used[n1]=true;
        used[llabs(n2)]=true;
        r.emplace_back(n1,n2);

    }
    return r;
}